

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles3::Functional::eval_selection_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  Vector<float,_4> *v;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  Vector<unsigned_int,_4> local_38;
  Vector<unsigned_int,_4> local_28;
  
  fVar1 = c->in[0].m_data[2];
  tcu::Vector<float,_4>::cast<unsigned_int>(&local_48);
  tcu::Vector<float,_4>::cast<unsigned_int>(&local_58);
  v = &local_58;
  if (0.0 < fVar1) {
    v = &local_48;
  }
  tcu::Vector<unsigned_int,_4>::Vector(&local_38,(Vector<unsigned_int,_4> *)v);
  tcu::Vector<unsigned_int,_4>::cast<float>(&local_28);
  *(undefined8 *)(c->color).m_data = local_28.m_data._0_8_;
  *(undefined8 *)((c->color).m_data + 2) = local_28.m_data._8_8_;
  return;
}

Assistant:

void eval_selection_uvec4	(ShaderEvalContext& c) { c.color		= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(3, 2, 1, 0).asUint(),	c.in[2].swizzle(0, 3, 2, 1).asUint()).asFloat(); }